

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stringutil.cpp
# Opt level: O1

void __thiscall
StringUtil_SplitAndJoinEmptyStringTest_Test::~StringUtil_SplitAndJoinEmptyStringTest_Test
          (StringUtil_SplitAndJoinEmptyStringTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(StringUtil, SplitAndJoinEmptyStringTest) {
  struct TestVector {
    std::string str;
    std::string delimiter;
    std::vector<std::string> expect;
  };
  std::vector<TestVector> test_vector = {
    {
      " ",
      "*",
      {" "}
    },
    {
      "**",
      "**",
      {"", ""}
    },
    {
      "**",
      "*",
      {"", "", ""}
    },
    {
      "",
      "*",
      {""}
    }
  };

  std::vector<std::string> actual_split_word;
  std::string actual_join_str;
  for (auto vec : test_vector) {
    EXPECT_NO_THROW(actual_split_word = StringUtil::Split(vec.str, vec.delimiter));
    EXPECT_EQ(actual_split_word, vec.expect);
    EXPECT_NO_THROW(actual_join_str = StringUtil::Join(actual_split_word, vec.delimiter));
    EXPECT_STREQ(actual_join_str.c_str(), vec.str.c_str());
  }
}